

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void * PaUtil_GroupAllocateMemory(PaUtilAllocationGroup *group,long size)

{
  long *plVar1;
  PaUtilAllocationGroupLink *pPVar2;
  long in_RSI;
  long *in_RDI;
  void *result;
  PaUtilAllocationGroupLink *link;
  PaUtilAllocationGroupLink *links;
  void *local_28;
  PaUtilAllocationGroupLink *in_stack_ffffffffffffffe0;
  PaUtilAllocationGroupLink *in_stack_ffffffffffffffe8;
  
  local_28 = (void *)0x0;
  if ((in_RDI[2] == 0) &&
     (pPVar2 = AllocateLinks(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0),
     pPVar2 != (PaUtilAllocationGroupLink *)0x0)) {
    *in_RDI = *in_RDI + *in_RDI;
    in_RDI[1] = (long)pPVar2;
    in_RDI[2] = (long)(pPVar2 + 1);
  }
  if ((in_RDI[2] != 0) &&
     (local_28 = PaUtil_AllocateMemory((long)in_stack_ffffffffffffffe0), local_28 != (void *)0x0)) {
    plVar1 = (long *)in_RDI[2];
    in_RDI[2] = *plVar1;
    plVar1[1] = (long)local_28;
    *plVar1 = in_RDI[3];
    in_RDI[3] = (long)plVar1;
  }
  return local_28;
}

Assistant:

void* PaUtil_GroupAllocateMemory( PaUtilAllocationGroup* group, long size )
{
    struct PaUtilAllocationGroupLink *links, *link;
    void *result = 0;
    
    /* allocate more links if necessary */
    if( !group->spareLinks )
    {
        /* double the link count on each block allocation */
        links = AllocateLinks( group->linkCount, group->linkBlocks, group->spareLinks );
        if( links )
        {
            group->linkCount += group->linkCount;
            group->linkBlocks = &links[0];
            group->spareLinks = &links[1];
        }
    }

    if( group->spareLinks )
    {
        result = PaUtil_AllocateMemory( size );
        if( result )
        {
            link = group->spareLinks;
            group->spareLinks = link->next;

            link->buffer = result;
            link->next = group->allocations;

            group->allocations = link;
        }
    }

    return result;    
}